

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

uint16_t __thiscall jbcoin::SerialIter::get16(SerialIter *this)

{
  uint8_t *puVar1;
  uint8_t *t;
  SerialIter *this_local;
  
  if (this->remain_ < 2) {
    Throw<std::runtime_error,char_const(&)[25]>((char (*) [25])"invalid SerialIter get16");
  }
  puVar1 = this->p_;
  this->p_ = this->p_ + 2;
  this->used_ = this->used_ + 2;
  this->remain_ = this->remain_ - 2;
  return CONCAT11(*puVar1,puVar1[1]);
}

Assistant:

std::uint16_t
SerialIter::get16()
{
    if (remain_ < 2)
        Throw<std::runtime_error> (
            "invalid SerialIter get16");
    auto t = p_;
    p_ += 2;
    used_ += 2;
    remain_ -= 2;
    return
        (std::uint64_t(t[0]) <<  8) +
         std::uint64_t(t[1]  );
}